

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# afhints.c
# Opt level: O1

void af_glyph_hints_save(AF_GlyphHints hints,FT_Outline *outline)

{
  AF_Point_conflict pAVar1;
  AF_Point_conflict pAVar2;
  FT_Vector *pFVar3;
  char *pcVar4;
  char cVar5;
  
  if (0 < (long)hints->num_points) {
    pAVar1 = hints->points;
    pAVar2 = pAVar1 + hints->num_points;
    pFVar3 = outline->points;
    pcVar4 = outline->tags;
    do {
      pFVar3->x = pAVar1->x;
      pFVar3->y = pAVar1->y;
      cVar5 = '\x02' - ((pAVar1->flags & 2) == 0);
      if ((pAVar1->flags & 1) != 0) {
        cVar5 = '\0';
      }
      *pcVar4 = cVar5;
      pAVar1 = pAVar1 + 1;
      pFVar3 = pFVar3 + 1;
      pcVar4 = pcVar4 + 1;
    } while (pAVar1 < pAVar2);
  }
  return;
}

Assistant:

FT_LOCAL_DEF( void )
  af_glyph_hints_save( AF_GlyphHints  hints,
                       FT_Outline*    outline )
  {
    AF_Point    point = hints->points;
    AF_Point    limit = point + hints->num_points;
    FT_Vector*  vec   = outline->points;
    char*       tag   = outline->tags;


    for ( ; point < limit; point++, vec++, tag++ )
    {
      vec->x = point->x;
      vec->y = point->y;

      if ( point->flags & AF_FLAG_CONIC )
        tag[0] = FT_CURVE_TAG_CONIC;
      else if ( point->flags & AF_FLAG_CUBIC )
        tag[0] = FT_CURVE_TAG_CUBIC;
      else
        tag[0] = FT_CURVE_TAG_ON;
    }
  }